

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
AddAllocator(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             *this,TBlockAllocatorType *allocator)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  TBlockAllocatorType *allocator_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  if (allocator == &this->allocatorHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x127,"(allocator != &this->allocatorHead)",
                       "allocator != &this->allocatorHead");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Initialize(allocator);
  allocator->next = (this->allocatorHead).next;
  allocator->prev = &this->allocatorHead;
  allocator->next->prev = allocator;
  (this->allocatorHead).next = allocator;
  allocator->bucket = &this->super_HeapBucket;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AddAllocator(TBlockAllocatorType * allocator)
{
    Assert(allocator != &this->allocatorHead);
    allocator->Initialize();
    allocator->next = this->allocatorHead.next;
    allocator->prev = &this->allocatorHead;
    allocator->next->prev = allocator;
    this->allocatorHead.next = allocator;
#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY)
    allocator->bucket = this;
#endif
}